

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O0

bool __thiscall
Fossilize::ExternalReplayer::Impl::poll_memory_usage
          (Impl *this,uint32_t *num_processes,ProcessStats *stats)

{
  SharedControlBlock *pSVar1;
  uint local_a0;
  uint local_9c;
  uint32_t i;
  uint32_t active_children;
  ProcessStats *stats_local;
  uint32_t *num_processes_local;
  Impl *this_local;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_3;
  
  pSVar1 = this->shm_block;
  std::operator&(memory_order_acquire,__memory_order_mask);
  local_9c = (pSVar1->num_processes_memory_stats).super___atomic_base<unsigned_int>._M_i;
  if (stats == (ProcessStats *)0x0) {
    *num_processes = local_9c;
  }
  else {
    if (*num_processes < local_9c) {
      local_9c = *num_processes;
    }
    else if (local_9c < *num_processes) {
      *num_processes = local_9c;
    }
    for (local_a0 = 0; local_a0 < local_9c; local_a0 = local_a0 + 1) {
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      stats[local_a0].resident_mib =
           pSVar1->process_reserved_memory_mib[local_a0].super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      stats[local_a0].shared_mib =
           pSVar1->process_shared_memory_mib[local_a0].super___atomic_base<unsigned_int>._M_i;
      pSVar1 = this->shm_block;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      stats[local_a0].heartbeats =
           pSVar1->process_heartbeats[local_a0].super___atomic_base<int>._M_i;
      if (local_a0 == 0) {
        stats->shared_metadata_mib = 0;
      }
      else {
        pSVar1 = this->shm_block;
        std::operator&(memory_order_relaxed,__memory_order_mask);
        stats[local_a0].shared_metadata_mib =
             (pSVar1->metadata_shared_size_mib).super___atomic_base<unsigned_int>._M_i;
      }
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::Impl::poll_memory_usage(uint32_t *num_processes, ProcessStats *stats) const
{
	uint32_t active_children = shm_block->num_processes_memory_stats.load(std::memory_order_acquire);

	if (stats)
	{
		if (active_children > *num_processes)
			active_children = *num_processes;
		else if (active_children < *num_processes)
			*num_processes = active_children;

		for (uint32_t i = 0; i < active_children; i++)
		{
			stats[i].resident_mib = shm_block->process_reserved_memory_mib[i].load(std::memory_order_relaxed);
			stats[i].shared_mib = shm_block->process_shared_memory_mib[i].load(std::memory_order_relaxed);
			stats[i].heartbeats = shm_block->process_heartbeats[i].load(std::memory_order_relaxed);

			if (i != 0)
				stats[i].shared_metadata_mib = shm_block->metadata_shared_size_mib.load(std::memory_order_relaxed);
			else
				stats[i].shared_metadata_mib = 0;
		}
	}
	else
		*num_processes = active_children;

	return true;
}